

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t helper_mulr_h(uint32_t arg00,uint32_t arg01,uint32_t arg10,uint32_t arg11,uint32_t n)

{
  bool bVar1;
  bool bVar2;
  int32_t sc0;
  int32_t sc1;
  uint32_t result1;
  uint32_t result0;
  uint32_t n_local;
  uint32_t arg11_local;
  uint32_t arg10_local;
  uint32_t arg01_local;
  uint32_t arg00_local;
  
  bVar1 = false;
  if (((arg00 & 0xffff) == 0x8000) && (bVar1 = false, (arg10 & 0xffff) == 0x8000)) {
    bVar1 = n == 1;
  }
  bVar2 = false;
  if (((arg01 & 0xffff) == 0x8000) && (bVar2 = false, (arg11 & 0xffff) == 0x8000)) {
    bVar2 = n == 1;
  }
  if (bVar1) {
    sc0 = 0x7fffffff;
  }
  else {
    sc0 = (arg00 * arg10 << ((byte)n & 0x1f)) + 0x8000;
  }
  if (bVar2) {
    sc1 = 0x7fffffff;
  }
  else {
    sc1 = (arg01 * arg11 << ((byte)n & 0x1f)) + 0x8000;
  }
  return sc0 & 0xffff0000U | (uint)sc1 >> 0x10;
}

Assistant:

uint32_t helper_mulr_h(uint32_t arg00, uint32_t arg01,
                       uint32_t arg10, uint32_t arg11, uint32_t n)
{
    uint32_t result0, result1;

    int32_t sc1 = ((arg00 & 0xffff) == 0x8000) &&
                  ((arg10 & 0xffff) == 0x8000) && (n == 1);
    int32_t sc0 = ((arg01 & 0xffff) == 0x8000) &&
                  ((arg11 & 0xffff) == 0x8000) && (n == 1);

    if (sc1) {
        result1 = 0x7fffffff;
    } else {
        result1 = ((arg00 * arg10) << n) + 0x8000;
    }
    if (sc0) {
        result0 = 0x7fffffff;
    } else {
        result0 = ((arg01 * arg11) << n) + 0x8000;
    }
    return (result1 & 0xffff0000) | (result0 >> 16);
}